

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::addFilteredEndpoint(FilterFederate *this,json *block,GlobalFederateId fed)

{
  initializer_list_t init;
  bool bVar1;
  BaseType BVar2;
  reference pvVar3;
  reference ppFVar4;
  BaseType in_EDX;
  long in_RDI;
  FilterInfo **fcc_1;
  iterator __end4;
  iterator __begin4;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *__range4;
  string dcloningFilter;
  FilterInfo **fcc;
  iterator __end3;
  iterator __begin3;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *__range3;
  string srcFilters;
  json eptBlock;
  BasicHandleInfo *ep;
  FilterCoordinator *fc;
  pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>
  *filt;
  const_iterator __end1;
  const_iterator __begin1;
  map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  char __c;
  BaseType in_stack_fffffffffffffc80;
  BaseType in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  reference in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  BaseType in_stack_fffffffffffffcb0;
  BaseType in_stack_fffffffffffffcb4;
  allocator<char> *in_stack_fffffffffffffcb8;
  reference in_stack_fffffffffffffcc0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *val_00;
  undefined4 in_stack_fffffffffffffcd0;
  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  local_270;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_259 [10];
  reference local_108;
  FilterInfo **local_100;
  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  local_f8;
  pointer local_f0;
  allocator<char> local_e1 [37];
  BaseType local_bc;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_a8 [2];
  BaseType local_84;
  GlobalFederateId local_80;
  BaseType local_7c;
  BasicHandleInfo *local_78;
  pointer local_70;
  reference local_68;
  _Self local_60;
  _Self local_58;
  long local_50;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_38 [3];
  GlobalFederateId local_4;
  
  local_4.gid = in_EDX;
  CLI::std::
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  ::initializer_list(local_38);
  init._M_array._4_4_ = in_stack_fffffffffffffc84;
  init._M_array._0_4_ = in_stack_fffffffffffffc80;
  init._M_len._0_4_ = in_stack_fffffffffffffc88;
  init._M_len._4_4_ = in_stack_fffffffffffffc8c;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::array(init);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffc78);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffc70);
  local_50 = in_RDI + 0x2a0;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
       ::begin((map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
                *)in_stack_fffffffffffffc68);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
       ::end((map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
              *)in_stack_fffffffffffffc68);
  val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
  while (bVar1 = std::operator==(&local_58,&local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_68 = std::
               _Rb_tree_const_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
                            *)0x645c9f);
    local_70 = std::
               unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
               ::get((unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                      *)in_stack_fffffffffffffc70);
    local_7c = (local_68->first).hid;
    local_78 = HandleManager::getInterfaceHandle
                         ((HandleManager *)
                          CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                          (InterfaceHandle)(BaseType)((ulong)val >> 0x20),
                          (InterfaceType)((ulong)in_stack_fffffffffffffc78 >> 0x38));
    local_80 = BasicHandleInfo::getFederateId(local_78);
    local_84 = local_4.gid;
    bVar1 = GlobalFederateId::operator!=(&local_80,local_4);
    if (!bVar1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (in_stack_fffffffffffffc90,val);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>(in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
      val_00 = local_a8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffc78);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffc70);
      BVar2 = InterfaceHandle::baseValue(&(local_78->handle).handle);
      local_bc = BVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<int,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffc70,(int *)in_stack_fffffffffffffc68);
      in_stack_fffffffffffffcc0 =
           nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>(in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffc78);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffc70);
      if ((local_70->hasSourceFilters & 1U) != 0) {
        in_stack_fffffffffffffcb8 = local_e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   (char *)in_stack_fffffffffffffca8,(allocator<char> *)in_stack_fffffffffffffca0);
        std::allocator<char>::~allocator(local_e1);
        local_f0 = local_70;
        local_f8._M_current =
             (FilterInfo **)
             std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::begin
                       ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                        in_stack_fffffffffffffc68);
        local_100 = (FilterInfo **)
                    std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::end
                              ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                                *)in_stack_fffffffffffffc68);
        while (bVar1 = __gnu_cxx::
                       operator==<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                                 ((__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                                   *)in_stack_fffffffffffffc70,
                                  (__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                                   *)in_stack_fffffffffffffc68), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_108 = __gnu_cxx::
                      __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                      ::operator*(&local_f8);
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x645f08);
          if (bVar1) {
            in_stack_fffffffffffffcb4 = GlobalBrokerId::baseValue(&(*local_108)->core_id);
            CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
            std::operator+(in_stack_fffffffffffffc78,
                           (char)((ulong)in_stack_fffffffffffffc70 >> 0x38));
            in_stack_fffffffffffffcb0 = InterfaceHandle::baseValue(&(*local_108)->handle);
            CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
            std::operator+(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
            std::__cxx11::string::~string(in_stack_fffffffffffffc70);
            std::__cxx11::string::~string(in_stack_fffffffffffffc70);
            std::__cxx11::string::~string(in_stack_fffffffffffffc70);
            std::__cxx11::string::~string(in_stack_fffffffffffffc70);
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   in_stack_fffffffffffffc78);
          }
          if (((*local_108)->cloning & 1U) != 0) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   (char *)in_stack_fffffffffffffc78);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                    (char)((ulong)in_stack_fffffffffffffc78 >> 0x38));
          __gnu_cxx::
          __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
          ::operator++(&local_f8);
        }
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                           (in_stack_fffffffffffffc70);
        if (*pvVar3 == ',') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back(in_stack_fffffffffffffc70);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                  (char)((ulong)in_stack_fffffffffffffc78 >> 0x38));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (in_stack_fffffffffffffc90,val);
        in_stack_fffffffffffffca8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffc78);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffc70);
        std::__cxx11::string::~string(in_stack_fffffffffffffc70);
      }
      if ((local_70->hasDestFilters & 1U) != 0) {
        if (local_70->destFilter != (FilterInfo *)0x0) {
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x64629e);
          if (bVar1) {
            GlobalBrokerId::baseValue(&local_70->destFilter->core_id);
            CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
            std::operator+(in_stack_fffffffffffffc78,
                           (char)((ulong)in_stack_fffffffffffffc70 >> 0x38));
            InterfaceHandle::baseValue(&local_70->destFilter->handle);
            CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
            std::operator+(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (in_stack_fffffffffffffc90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
            in_stack_fffffffffffffc90 =
                 nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           (in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffc78);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffc70);
            std::__cxx11::string::~string(in_stack_fffffffffffffc70);
            std::__cxx11::string::~string(in_stack_fffffffffffffc70);
            std::__cxx11::string::~string(in_stack_fffffffffffffc70);
            std::__cxx11::string::~string(in_stack_fffffffffffffc70);
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (in_stack_fffffffffffffc90,val);
            in_stack_fffffffffffffca0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           (in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffc78);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffc70);
          }
        }
        bVar1 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::empty
                          ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                           CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        if (!bVar1) {
          val = local_259;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                     (char *)in_stack_fffffffffffffca8,(allocator<char> *)in_stack_fffffffffffffca0)
          ;
          std::allocator<char>::~allocator((allocator<char> *)local_259);
          local_268 = &local_70->cloningDestFilters;
          local_270._M_current =
               (FilterInfo **)
               std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::begin
                         ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                          in_stack_fffffffffffffc68);
          std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::end
                    ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                     in_stack_fffffffffffffc68);
          while (bVar1 = __gnu_cxx::
                         operator==<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                                   ((__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                                     *)in_stack_fffffffffffffc70,
                                    (__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                                     *)in_stack_fffffffffffffc68), ((bVar1 ^ 0xffU) & 1) != 0) {
            ppFVar4 = __gnu_cxx::
                      __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                      ::operator*(&local_270);
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x6465d8);
            if (bVar1) {
              in_stack_fffffffffffffc84 = GlobalBrokerId::baseValue(&(*ppFVar4)->core_id);
              CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
              std::operator+(in_stack_fffffffffffffc78,
                             (char)((ulong)in_stack_fffffffffffffc70 >> 0x38));
              in_stack_fffffffffffffc80 = InterfaceHandle::baseValue(&(*ppFVar4)->handle);
              CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
              std::operator+(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
              std::__cxx11::string::~string(in_stack_fffffffffffffc70);
              std::__cxx11::string::~string(in_stack_fffffffffffffc70);
              std::__cxx11::string::~string(in_stack_fffffffffffffc70);
              std::__cxx11::string::~string(in_stack_fffffffffffffc70);
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     in_stack_fffffffffffffc78);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                      (char)((ulong)in_stack_fffffffffffffc78 >> 0x38));
            __gnu_cxx::
            __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
            ::operator++(&local_270);
          }
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                             (in_stack_fffffffffffffc70);
          __c = (char)((ulong)in_stack_fffffffffffffc78 >> 0x38);
          if (*pvVar3 == ',') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back(in_stack_fffffffffffffc70);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),__c);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (in_stack_fffffffffffffc90,val);
          in_stack_fffffffffffffc78 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8)
          ;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffc78);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffc70);
          std::__cxx11::string::~string(in_stack_fffffffffffffc70);
        }
      }
      in_stack_fffffffffffffc70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>(in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)CONCAT44(BVar2,in_stack_fffffffffffffcd0),val_00);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffc70);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
                  *)in_stack_fffffffffffffc70);
  }
  return;
}

Assistant:

void FilterFederate::addFilteredEndpoint(nlohmann::json& block, GlobalFederateId fed) const
{
    block["endpoints"] = nlohmann::json::array();
    for (const auto& filt : filterCoord) {
        auto* fc = filt.second.get();
        const auto* ep = mHandles->getInterfaceHandle(filt.first, InterfaceType::ENDPOINT);
        if (ep->getFederateId() != fed) {
            continue;
        }
        nlohmann::json eptBlock;

        eptBlock["name"] = ep->key;
        eptBlock["id"] = ep->handle.handle.baseValue();
        if (fc->hasSourceFilters) {
            std::string srcFilters = "[";
            for (auto& fcc : fc->sourceFilters) {
                if (!fcc->key.empty()) {
                    srcFilters.append(fcc->key);
                } else {
                    srcFilters += std::to_string(fcc->core_id.baseValue()) + ':' +
                        std::to_string(fcc->handle.baseValue());
                }
                if (fcc->cloning) {
                    srcFilters.append("(cloning)");
                }
                srcFilters.push_back(',');
            }
            if (srcFilters.back() == ',') {
                srcFilters.pop_back();
            }
            srcFilters.push_back(']');
            eptBlock["srcFilters"] = srcFilters;
        }
        if (fc->hasDestFilters) {
            if (fc->destFilter != nullptr) {
                if (!fc->destFilter->key.empty()) {
                    eptBlock["destFilter"] = fc->destFilter->key;
                } else {
                    eptBlock["destFilter"] = std::to_string(fc->destFilter->core_id.baseValue()) +
                        ':' + std::to_string(fc->destFilter->handle.baseValue());
                }
            }
            if (!fc->cloningDestFilters.empty()) {
                std::string dcloningFilter = "[";
                for (auto& fcc : fc->cloningDestFilters) {
                    if (!fcc->key.empty()) {
                        dcloningFilter.append(fcc->key);
                    } else {
                        dcloningFilter += std::to_string(fcc->core_id.baseValue()) + ':' +
                            std::to_string(fcc->handle.baseValue());
                    }
                    dcloningFilter.push_back(',');
                }
                if (dcloningFilter.back() == ',') {
                    dcloningFilter.pop_back();
                }
                dcloningFilter.push_back(']');
                eptBlock["cloningdestFilter"] = dcloningFilter;
            }
        }
        block["endpoints"].push_back(std::move(eptBlock));
    }
}